

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraIndVer.c
# Opt level: O2

int Fra_InvariantVerify(Aig_Man_t *pAig,int nFrames,Vec_Int_t *vClauses,Vec_Int_t *vLits)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  abctime aVar7;
  Cnf_Dat_t *p;
  sat_solver *psVar8;
  long lVar9;
  abctime aVar10;
  long lVar11;
  int iVar12;
  char *__assertion;
  long lVar13;
  uint local_44;
  
  aVar7 = Abc_Clock();
  if (nFrames == 1) {
    p = Cnf_DeriveSimple(pAig,pAig->nObjs[3]);
    psVar8 = (sat_solver *)Cnf_DataWriteIntoSolver(p,1,1);
    piVar3 = vLits->pArray;
    local_44 = 0;
    iVar5 = 0;
    for (iVar12 = 0; iVar12 < vClauses->nSize; iVar12 = iVar12 + 1) {
      iVar4 = Vec_IntEntry(vClauses,iVar12);
      lVar11 = (long)iVar4;
      lVar13 = (long)iVar5;
      for (lVar9 = lVar13; lVar9 < lVar11; lVar9 = lVar9 + 1) {
        *(byte *)(piVar3 + lVar9) = *(byte *)(piVar3 + lVar9) ^ 1;
      }
      iVar5 = sat_solver_solve(psVar8,piVar3 + lVar13,piVar3 + lVar11,0,0,0,0);
      for (; lVar13 < lVar11; lVar13 = lVar13 + 1) {
        *(byte *)(piVar3 + lVar13) = *(byte *)(piVar3 + lVar13) ^ 1;
      }
      local_44 = local_44 + (iVar5 != -1);
      iVar5 = iVar4;
    }
    sat_solver_delete(psVar8);
    psVar8 = (sat_solver *)Cnf_DataWriteIntoSolver(p,2,0);
    if (psVar8->size != p->nVars * 2) {
      __assertion = "pSat->size == 2 * pCnf->nVars";
      uVar1 = 100;
LAB_004fd9fa:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraIndVer.c"
                    ,uVar1,"int Fra_InvariantVerify(Aig_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
    }
    piVar3 = vLits->pArray;
    iVar12 = 0;
    iVar5 = 0;
    do {
      if (vClauses->nSize <= iVar12) {
        if (psVar8->qtail != psVar8->qhead) {
          iVar5 = sat_solver_simplify(psVar8);
          if (iVar5 == 0) {
            __assertion = "RetValue != 0";
            uVar1 = 0x78;
            goto LAB_004fd9fa;
          }
          if (psVar8->qtail != psVar8->qhead) {
            __assertion = "pSat->qtail == pSat->qhead";
            uVar1 = 0x79;
            goto LAB_004fd9fa;
          }
        }
        piVar3 = vLits->pArray;
        uVar1 = 0;
        iVar5 = 0;
        for (iVar12 = 0; iVar12 < vClauses->nSize; iVar12 = iVar12 + 1) {
          iVar4 = Vec_IntEntry(vClauses,iVar12);
          lVar13 = (long)iVar4;
          lVar11 = (long)iVar5;
          for (lVar9 = lVar11; lVar9 < lVar13; lVar9 = lVar9 + 1) {
            piVar3[lVar9] = p->nVars * 2 + piVar3[lVar9] ^ 1;
          }
          iVar5 = sat_solver_solve(psVar8,piVar3 + lVar11,piVar3 + lVar13,0,0,0,0);
          for (; lVar11 < lVar13; lVar11 = lVar11 + 1) {
            uVar2 = piVar3[lVar11];
            piVar3[lVar11] = uVar2 ^ 1;
            piVar3[lVar11] = (uVar2 ^ 1) + p->nVars * -2;
          }
          uVar1 = uVar1 + (iVar5 != -1);
          iVar5 = iVar4;
        }
        sat_solver_delete(psVar8);
        Cnf_DataFree(p);
        if (local_44 != 0) {
          printf("Invariant verification: %d clauses (out of %d) FAILED the base case.\n",
                 (ulong)local_44,(ulong)(uint)vClauses->nSize);
        }
        if (uVar1 != 0) {
          printf("Invariant verification: %d clauses (out of %d) FAILED the inductive case.\n",
                 (ulong)uVar1,(ulong)(uint)vClauses->nSize);
        }
        if (uVar1 != 0 || local_44 != 0) {
          return 0;
        }
        iVar5 = 0x7dcb36;
        printf("Invariant verification: %d clauses verified correctly.  ",
               (ulong)(uint)vClauses->nSize);
        Abc_Print(iVar5,"%s =","Time");
        aVar10 = Abc_Clock();
        Abc_Print(iVar5,"%9.2f sec\n",(double)(aVar10 - aVar7) / 1000000.0);
        goto LAB_004fd78e;
      }
      iVar4 = Vec_IntEntry(vClauses,iVar12);
      iVar6 = sat_solver_addclause(psVar8,piVar3 + iVar5,piVar3 + iVar4);
      iVar12 = iVar12 + 1;
      iVar5 = iVar4;
    } while (iVar6 != 0);
    Cnf_DataFree(p);
    sat_solver_delete(psVar8);
    puts("Invariant verification: SAT solver is unsat after adding a clause.");
    iVar5 = 0;
  }
  else {
    puts("Invariant verification: Can only verify for K = 1");
LAB_004fd78e:
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verifies the inductive invariant.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Fra_InvariantVerify( Aig_Man_t * pAig, int nFrames, Vec_Int_t * vClauses, Vec_Int_t * vLits )
{
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int * pStart;
    int RetValue, Beg, End, i, k;
    int CounterBase = 0, CounterInd = 0;
    abctime clk = Abc_Clock();

    if ( nFrames != 1 )
    {
        printf( "Invariant verification: Can only verify for K = 1\n" );
        return 1;
    }

    // derive CNF
    pCnf = Cnf_DeriveSimple( pAig, Aig_ManCoNum(pAig) );
/*
    // add the property
    {
        Aig_Obj_t * pObj;
        int Lits[1];

        pObj = Aig_ManCo( pAig, 0 );
        Lits[0] = toLitCond( pCnf->pVarNums[pObj->Id], 1 ); 

        Vec_IntPush( vLits, Lits[0] );
        Vec_IntPush( vClauses, Vec_IntSize(vLits) );
        printf( "Added the target property to the set of clauses to be inductively checked.\n" );
    }
*/
    // derive initialized frames for the base case
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, nFrames, 1 );
    // check clauses in the base case
    Beg = 0;
    pStart = Vec_IntArray( vLits );
    Vec_IntForEachEntry( vClauses, End, i )
    {
        // complement the literals
        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg(pStart[k]);
        RetValue = sat_solver_solve( pSat, pStart + Beg, pStart + End, 0, 0, 0, 0 );
        for ( k = Beg; k < End; k++ )
            pStart[k] = lit_neg(pStart[k]);
        Beg = End;
        if ( RetValue == l_False )
            continue;
//        printf( "Clause %d failed the base case.\n", i );
        CounterBase++;
    }
    sat_solver_delete( pSat );

    // derive initialized frames for the base case
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, nFrames + 1, 0 );
    assert( pSat->size == 2 * pCnf->nVars );
    // add clauses to the first frame
    Beg = 0;
    pStart = Vec_IntArray( vLits );
    Vec_IntForEachEntry( vClauses, End, i )
    {
        RetValue = sat_solver_addclause( pSat, pStart + Beg, pStart + End );
        Beg = End;
        if ( RetValue == 0 )
        {
            Cnf_DataFree( pCnf );
            sat_solver_delete( pSat );
            printf( "Invariant verification: SAT solver is unsat after adding a clause.\n" );
            return 0;
        }
    }
    // simplify the solver
    if ( pSat->qtail != pSat->qhead )
    {
        RetValue = sat_solver_simplify(pSat);
        assert( RetValue != 0 );
        assert( pSat->qtail == pSat->qhead );
    }

    // check clauses in the base case
    Beg = 0;
    pStart = Vec_IntArray( vLits );
    Vec_IntForEachEntry( vClauses, End, i )
    {
        // complement the literals
        for ( k = Beg; k < End; k++ )
        {
            pStart[k] += 2 * pCnf->nVars;
            pStart[k] = lit_neg(pStart[k]);
        }
        RetValue = sat_solver_solve( pSat, pStart + Beg, pStart + End, 0, 0, 0, 0 );
        for ( k = Beg; k < End; k++ )
        {
            pStart[k] = lit_neg(pStart[k]);
            pStart[k] -= 2 * pCnf->nVars;
        }
        Beg = End;
        if ( RetValue == l_False )
            continue;
//        printf( "Clause %d failed the inductive case.\n", i );
        CounterInd++;
    }
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    if ( CounterBase )
        printf( "Invariant verification: %d clauses (out of %d) FAILED the base case.\n", CounterBase, Vec_IntSize(vClauses) );
    if ( CounterInd )
        printf( "Invariant verification: %d clauses (out of %d) FAILED the inductive case.\n", CounterInd, Vec_IntSize(vClauses) );
    if ( CounterBase || CounterInd )
        return 0;
    printf( "Invariant verification: %d clauses verified correctly.  ", Vec_IntSize(vClauses) );
    ABC_PRT( "Time", Abc_Clock() - clk );
    return 1;
}